

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

int SSL_write(SSL *ssl,void *buf,int num)

{
  code *pcVar1;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  int local_5c;
  Span<const_unsigned_char> local_48;
  byte local_31;
  undefined8 uStack_30;
  bool needs_handshake;
  size_t bytes_written;
  int ret;
  int num_local;
  void *buf_local;
  SSL *ssl_local;
  
  bytes_written._4_4_ = num;
  _ret = (uchar *)buf;
  buf_local = ssl;
  bssl::ssl_reset_error_state((SSL *)ssl);
  iVar4 = SSL_is_quic((SSL *)buf_local);
  if (iVar4 == 0) {
    if (*(long *)((long)buf_local + 0x28) == 0) {
      ERR_put_error(0x10,0,0xe2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                    ,0x3b7);
      ssl_local._4_4_ = -1;
    }
    else {
      bytes_written._0_4_ = 0;
      uStack_30 = 0;
      local_31 = 0;
      do {
        bVar3 = bssl::ssl_can_write((SSL *)buf_local);
        if (!bVar3) {
          bytes_written._0_4_ = SSL_do_handshake((SSL *)buf_local);
          if ((int)bytes_written < 0) {
            return (int)bytes_written;
          }
          if ((int)bytes_written == 0) {
            ERR_put_error(0x10,0,0xd7,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                          ,0x3c6);
            return -1;
          }
        }
        pvVar2 = buf_local;
        if (bytes_written._4_4_ < 0) {
          ERR_put_error(0x10,0,0x6f,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                        ,0x3cc);
          return -1;
        }
        pcVar1 = *(code **)(*buf_local + 0x48);
        bssl::Span<const_unsigned_char>::Span(&local_48,_ret,(long)bytes_written._4_4_);
        local_5c = (*pcVar1)(pvVar2,&local_31,&stack0xffffffffffffffd0,local_48.data_,local_48.size_
                            );
        bytes_written._0_4_ = local_5c;
      } while ((local_31 & 1) != 0);
      if (0 < local_5c) {
        local_5c = (int)uStack_30;
      }
      ssl_local._4_4_ = local_5c;
    }
  }
  else {
    ERR_put_error(0x10,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                  ,0x3b2);
    ssl_local._4_4_ = -1;
  }
  return ssl_local._4_4_;
}

Assistant:

int SSL_write(SSL *ssl, const void *buf, int num) {
  ssl_reset_error_state(ssl);

  if (SSL_is_quic(ssl)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return -1;
  }

  if (ssl->do_handshake == NULL) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNINITIALIZED);
    return -1;
  }

  int ret = 0;
  size_t bytes_written = 0;
  bool needs_handshake = false;
  do {
    // If necessary, complete the handshake implicitly.
    if (!ssl_can_write(ssl)) {
      ret = SSL_do_handshake(ssl);
      if (ret < 0) {
        return ret;
      }
      if (ret == 0) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_SSL_HANDSHAKE_FAILURE);
        return -1;
      }
    }

    if (num < 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_LENGTH);
      return -1;
    }
    ret = ssl->method->write_app_data(
        ssl, &needs_handshake, &bytes_written,
        Span(static_cast<const uint8_t *>(buf), static_cast<size_t>(num)));
  } while (needs_handshake);
  return ret <= 0 ? ret : static_cast<int>(bytes_written);
}